

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

bool DeploymentActiveAfter<Consensus::BuriedDeployment>
               (CBlockIndex *pindexPrev,ChainstateManager *chainman,BuriedDeployment dep)

{
  bool bVar1;
  undefined2 in_DX;
  undefined8 in_RSI;
  BuriedDeployment dep_00;
  ChainstateManager *in_RDI;
  long in_FS_OFFSET;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  CBlockIndex *pindexPrev_00;
  
  dep_00 = (BuriedDeployment)((ulong)in_RSI >> 0x30);
  pindexPrev_00 = *(CBlockIndex **)(in_FS_OFFSET + 0x28);
  ChainstateManager::GetConsensus(in_RDI);
  bVar1 = DeploymentActiveAfter
                    (pindexPrev_00,(Params *)in_RDI,dep_00,
                     (VersionBitsCache *)
                     CONCAT26(in_DX,CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0)));
  if (*(CBlockIndex **)(in_FS_OFFSET + 0x28) == pindexPrev_00) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentActiveAfter(const CBlockIndex* pindexPrev, const ChainstateManager& chainman, DEP dep)
{
    return DeploymentActiveAfter(pindexPrev, chainman.GetConsensus(), dep, chainman.m_versionbitscache);
}